

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zmqBrokerServer.cpp
# Opt level: O2

void __thiscall
helics::apps::zmqBrokerServer::startServer
          (zmqBrokerServer *this,json *val,shared_ptr<helics::apps::TypedBrokerServer> *param_2)

{
  string_view message;
  string_view message_00;
  json *pjVar1;
  long *plVar2;
  thread in_stack_ffffffffffffffd8;
  char *in_stack_ffffffffffffffe0;
  
  pjVar1 = &::null_abi_cxx11_;
  if (val != (json *)0x0) {
    pjVar1 = val;
  }
  this->config_ = pjVar1;
  if (this->zmq_enabled_ == true) {
    message._M_str = in_stack_ffffffffffffffe0;
    message._M_len = (size_t)in_stack_ffffffffffffffd8._M_id._M_thread;
    TypedBrokerServer::logMessage(message);
  }
  if (this->zmqss_enabled_ == true) {
    message_00._M_str = in_stack_ffffffffffffffe0;
    message_00._M_len = (size_t)in_stack_ffffffffffffffd8._M_id._M_thread;
    TypedBrokerServer::logMessage(message_00);
  }
  CLI::std::mutex::lock(&this->threadGuard);
  plVar2 = (long *)operator_new(0x10);
  *plVar2 = (long)&PTR___State_004c0148;
  plVar2[1] = (long)this;
  std::thread::_M_start_thread(&stack0xffffffffffffffd8,&stack0xffffffffffffffe0,0);
  if (plVar2 != (long *)0x0) {
    (**(code **)(*plVar2 + 8))();
  }
  CLI::std::thread::operator=(&this->mainLoopThread,(thread *)&stack0xffffffffffffffd8);
  CLI::std::thread::~thread((thread *)&stack0xffffffffffffffd8);
  pthread_mutex_unlock((pthread_mutex_t *)&this->threadGuard);
  return;
}

Assistant:

void zmqBrokerServer::startServer(const nlohmann::json* val,
                                  const std::shared_ptr<TypedBrokerServer>& /*ptr*/)
{
    config_ = (val != nullptr) ? val : &null;
#ifdef HELICS_ENABLE_ZMQ_CORE
    if (zmq_enabled_) {
        logMessage("starting zmq broker server");
    }
    if (zmqss_enabled_) {
        logMessage("starting zmq ss broker server");
    }
    std::lock_guard<std::mutex> tlock(threadGuard);
    mainLoopThread = std::thread([this]() { mainLoop(); });
#endif
}